

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint flag)

{
  bool bVar1;
  InstOp IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  EmptyOp EVar6;
  ostream *poVar7;
  LogMessage local_1b8;
  Inst *local_38;
  Inst *ip;
  int *piStack_28;
  int nstk;
  int *stk;
  uint flag_local;
  int id_local;
  Workq *q_local;
  DFA *this_local;
  
  piStack_28 = this->astack_;
  ip._4_4_ = 1;
  *piStack_28 = id;
  stk._0_4_ = flag;
  stk._4_4_ = id;
  _flag_local = q;
  q_local = (Workq *)this;
LAB_0015935b:
  do {
    if (ip._4_4_ < 1) {
      return;
    }
    if (this->nastack_ < ip._4_4_) {
      __assert_fail("(nstk) <= (nastack_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                    0x32e,"void re2::DFA::AddToQueue(Workq *, int, uint)");
    }
    ip._4_4_ = ip._4_4_ + -1;
    stk._4_4_ = piStack_28[ip._4_4_];
    while (stk._4_4_ != -1) {
      if ((stk._4_4_ == 0) ||
         (bVar1 = SparseSet::contains(&_flag_local->super_SparseSet,stk._4_4_), bVar1))
      goto LAB_0015935b;
      Workq::insert_new(_flag_local,stk._4_4_);
      local_38 = Prog::inst(this->prog_,stk._4_4_);
      IVar2 = Prog::Inst::opcode(local_38);
      switch(IVar2) {
      case kInstAltMatch:
        iVar3 = Prog::Inst::last(local_38);
        if (iVar3 != 0) {
          __assert_fail("!ip->last()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                        ,0x361,"void re2::DFA::AddToQueue(Workq *, int, uint)");
        }
        stk._4_4_ = stk._4_4_ + 1;
        break;
      case kInstByteRange:
      case kInstMatch:
        iVar3 = Prog::Inst::last(local_38);
        if (iVar3 != 0) goto LAB_0015935b;
        stk._4_4_ = stk._4_4_ + 1;
        break;
      case kInstCapture:
      case kInstNop:
        iVar3 = Prog::Inst::last(local_38);
        if (iVar3 == 0) {
          piStack_28[ip._4_4_] = stk._4_4_ + 1;
          ip._4_4_ = ip._4_4_ + 1;
        }
        IVar2 = Prog::Inst::opcode(local_38);
        if ((((IVar2 == kInstNop) &&
             (iVar4 = Workq::maxmark(_flag_local), iVar3 = stk._4_4_, 0 < iVar4)) &&
            (iVar5 = Prog::start_unanchored(this->prog_), iVar4 = stk._4_4_, iVar3 == iVar5)) &&
           (iVar3 = Prog::start(this->prog_), iVar4 != iVar3)) {
          piStack_28[ip._4_4_] = -1;
          ip._4_4_ = ip._4_4_ + 1;
        }
        stk._4_4_ = Prog::Inst::out(local_38);
        break;
      case kInstEmptyWidth:
        iVar3 = Prog::Inst::last(local_38);
        if (iVar3 == 0) {
          piStack_28[ip._4_4_] = stk._4_4_ + 1;
          ip._4_4_ = ip._4_4_ + 1;
        }
        EVar6 = Prog::Inst::empty(local_38);
        if ((EVar6 & ((EmptyOp)stk ^ 0xffffffff)) != 0) goto LAB_0015935b;
        stk._4_4_ = Prog::Inst::out(local_38);
        break;
      default:
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                   0x347);
        poVar7 = LogMessage::stream(&local_1b8);
        poVar7 = std::operator<<(poVar7,"unhandled opcode: ");
        IVar2 = Prog::Inst::opcode(local_38);
        std::ostream::operator<<(poVar7,IVar2);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
        goto LAB_0015935b;
      }
    }
    Workq::mark(_flag_local);
  } while( true );
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint flag) {

  // Use astack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = astack_;
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, nastack_);
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}